

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_macro_function.cpp
# Opt level: O2

unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> __thiscall
duckdb::ScalarMacroFunction::Deserialize(ScalarMacroFunction *this,Deserializer *deserializer)

{
  tuple<duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_> this_00;
  pointer pSVar1;
  __uniq_ptr_impl<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>
  .super__Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>
        )operator_new(0x68);
  ScalarMacroFunction((ScalarMacroFunction *)
                      this_00.
                      super__Tuple_impl<0UL,_duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>
                      .super__Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>
  .super__Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>._M_head_impl =
       (tuple<duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>)
       (tuple<duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>
       .super__Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>._M_head_impl;
  pSVar1 = unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
           ::operator->((unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,200,"expression",&pSVar1->expression);
  (this->super_MacroFunction)._vptr_MacroFunction =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>
       .super__Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)
         (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)this;
}

Assistant:

unique_ptr<MacroFunction> ScalarMacroFunction::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ScalarMacroFunction>(new ScalarMacroFunction());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "expression", result->expression);
	return std::move(result);
}